

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_test.cc
# Opt level: O0

void __thiscall
ASN1Test_MissingRequiredField_Test::TestBody(ASN1Test_MissingRequiredField_Test *this)

{
  bool bVar1;
  char *pcVar2;
  const_iterator poVar3;
  REQUIRED_FIELD *pRVar4;
  type pRVar5;
  pointer pRVar6;
  const_iterator poVar7;
  const_iterator poVar8;
  char *in_R9;
  AssertHelper local_278;
  Message local_270;
  int local_268 [2];
  undefined1 local_260 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_230;
  Message local_228;
  undefined1 local_220 [8];
  AssertionResult gtest_ar__2;
  offset_in_REQUIRED_FIELD_to_unknown field_2;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  undefined8 local_1f0;
  undefined8 local_1e8;
  initializer_list<asn1_null_st_*REQUIRED_FIELD::*> local_1e0;
  initializer_list<asn1_null_st_*REQUIRED_FIELD::*> *local_1d0;
  initializer_list<asn1_null_st_*REQUIRED_FIELD::*> *__range1_2;
  Message local_1c0;
  int local_1b8 [2];
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_180;
  Message local_178;
  undefined1 local_170 [8];
  AssertionResult gtest_ar__1;
  offset_in_REQUIRED_FIELD_to_unknown field_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  undefined8 local_140;
  undefined8 local_138;
  initializer_list<stack_st_ASN1_INTEGER_*REQUIRED_FIELD::*> local_130;
  initializer_list<stack_st_ASN1_INTEGER_*REQUIRED_FIELD::*> *local_120;
  initializer_list<stack_st_ASN1_INTEGER_*REQUIRED_FIELD::*> *__range1_1;
  Message local_110;
  int local_108 [2];
  undefined1 local_100 [8];
  AssertionResult gtest_ar_1;
  string local_e8;
  AssertHelper local_c8;
  Message local_c0;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_;
  offset_in_REQUIRED_FIELD_to_unknown field;
  const_iterator __end1;
  const_iterator __begin1;
  undefined8 local_88;
  undefined8 local_80;
  initializer_list<asn1_string_st_*REQUIRED_FIELD::*> local_78;
  initializer_list<asn1_string_st_*REQUIRED_FIELD::*> *local_68;
  initializer_list<asn1_string_st_*REQUIRED_FIELD::*> *__range1;
  undefined1 local_58 [8];
  unique_ptr<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)> obj;
  Message local_40 [3];
  int local_28 [2];
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  ASN1Test_MissingRequiredField_Test *this_local;
  
  local_28[1] = 0xffffffff;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  local_28[0] = i2d_REQUIRED_FIELD((REQUIRED_FIELD *)0x0,(uchar **)0x0);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_20,"-1","i2d_REQUIRED_FIELD(nullptr, nullptr)",local_28 + 1,local_28)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_40);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &obj._M_t.super___uniq_ptr_impl<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)>._M_t.
                super__Tuple_impl<0UL,_REQUIRED_FIELD_*,_void_(*)(REQUIRED_FIELD_*)>.
                super__Head_base<0UL,_REQUIRED_FIELD_*,_false>,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
               ,0xa98,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &obj._M_t.super___uniq_ptr_impl<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)>._M_t.
                super__Tuple_impl<0UL,_REQUIRED_FIELD_*,_void_(*)(REQUIRED_FIELD_*)>.
                super__Head_base<0UL,_REQUIRED_FIELD_*,_false>,local_40);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &obj._M_t.super___uniq_ptr_impl<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)>._M_t.
                super__Tuple_impl<0UL,_REQUIRED_FIELD_*,_void_(*)(REQUIRED_FIELD_*)>.
                super__Head_base<0UL,_REQUIRED_FIELD_*,_false>);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  __range1 = (initializer_list<asn1_string_st_*REQUIRED_FIELD::*> *)REQUIRED_FIELD_free;
  std::unique_ptr<REQUIRED_FIELD,void(*)(REQUIRED_FIELD*)>::
  unique_ptr<void(*)(REQUIRED_FIELD*),void>
            ((unique_ptr<REQUIRED_FIELD,void(*)(REQUIRED_FIELD*)> *)local_58,(pointer)0x0,
             (__enable_if_t<_is_lvalue_reference<void_(*)(REQUIRED_FIELD_*)>::value,_void_(*&&)(REQUIRED_FIELD_*)>
              )&__range1);
  __begin1 = (const_iterator)0x0;
  local_88 = 8;
  local_80 = 0x10;
  local_78._M_array = (iterator)&__begin1;
  local_78._M_len = 3;
  local_68 = &local_78;
  __end1 = std::initializer_list<asn1_string_st_*REQUIRED_FIELD::*>::begin(local_68);
  poVar3 = std::initializer_list<asn1_string_st_*REQUIRED_FIELD::*>::end(local_68);
  for (; __end1 != poVar3; __end1 = __end1 + 1) {
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )*__end1;
    pRVar4 = REQUIRED_FIELD_new();
    std::unique_ptr<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)>::reset
              ((unique_ptr<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)> *)local_58,pRVar4);
    testing::AssertionResult::
    AssertionResult<std::unique_ptr<REQUIRED_FIELD,void(*)(REQUIRED_FIELD*)>>
              ((AssertionResult *)local_b8,
               (unique_ptr<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)> *)local_58,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
    if (!bVar1) {
      testing::Message::Message(&local_c0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_e8,(internal *)local_b8,(AssertionResult *)0x8733ab,"false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0xa9f,pcVar2);
      testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      std::__cxx11::string::~string((string *)&local_e8);
      testing::Message::~Message(&local_c0);
    }
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
    if (gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ != 0) goto LAB_0021178f;
    pRVar5 = std::unique_ptr<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)>::operator*
                       ((unique_ptr<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)> *)local_58);
    ASN1_INTEGER_free(*(ASN1_INTEGER **)
                       ((long)&pRVar5->value +
                       (long)gtest_ar_.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl));
    pRVar5 = std::unique_ptr<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)>::operator*
                       ((unique_ptr<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)> *)local_58);
    *(undefined8 *)
     ((long)&pRVar5->value +
     (long)gtest_ar_.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl) = 0;
    local_108[1] = 0xffffffff;
    pRVar6 = std::unique_ptr<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)>::get
                       ((unique_ptr<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)> *)local_58);
    local_108[0] = i2d_REQUIRED_FIELD(pRVar6,(uchar **)0x0);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_100,"-1","i2d_REQUIRED_FIELD(obj.get(), nullptr)",local_108 + 1,
               local_108);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
    if (!bVar1) {
      testing::Message::Message(&local_110);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&__range1_1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0xaa2,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&__range1_1,&local_110);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&__range1_1);
      testing::Message::~Message(&local_110);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  }
  __begin1_1 = (const_iterator)0x18;
  local_140 = 0x20;
  local_138 = 0x28;
  local_130._M_array = (iterator)&__begin1_1;
  local_130._M_len = 3;
  local_120 = &local_130;
  __end1_1 = std::initializer_list<stack_st_ASN1_INTEGER_*REQUIRED_FIELD::*>::begin(local_120);
  poVar7 = std::initializer_list<stack_st_ASN1_INTEGER_*REQUIRED_FIELD::*>::end(local_120);
  for (; __end1_1 != poVar7; __end1_1 = __end1_1 + 1) {
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )*__end1_1;
    pRVar4 = REQUIRED_FIELD_new();
    std::unique_ptr<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)>::reset
              ((unique_ptr<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)> *)local_58,pRVar4);
    testing::AssertionResult::
    AssertionResult<std::unique_ptr<REQUIRED_FIELD,void(*)(REQUIRED_FIELD*)>>
              ((AssertionResult *)local_170,
               (unique_ptr<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)> *)local_58,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
    if (!bVar1) {
      testing::Message::Message(&local_178);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_2.message_,(internal *)local_170,(AssertionResult *)0x8733ab,
                 "false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_180,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0xaa8,pcVar2);
      testing::internal::AssertHelper::operator=(&local_180,&local_178);
      testing::internal::AssertHelper::~AssertHelper(&local_180);
      std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_178);
    }
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
    if (gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ != 0) goto LAB_0021178f;
    pRVar5 = std::unique_ptr<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)>::operator*
                       ((unique_ptr<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)> *)local_58);
    sk_ASN1_INTEGER_pop_free
              (*(stack_st_ASN1_INTEGER **)
                ((long)&pRVar5->value +
                (long)gtest_ar__1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl),ASN1_INTEGER_free);
    pRVar5 = std::unique_ptr<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)>::operator*
                       ((unique_ptr<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)> *)local_58);
    *(undefined8 *)
     ((long)&pRVar5->value +
     (long)gtest_ar__1.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl) = 0;
    local_1b8[1] = 0xffffffff;
    pRVar6 = std::unique_ptr<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)>::get
                       ((unique_ptr<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)> *)local_58);
    local_1b8[0] = i2d_REQUIRED_FIELD(pRVar6,(uchar **)0x0);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_1b0,"-1","i2d_REQUIRED_FIELD(obj.get(), nullptr)",local_1b8 + 1,
               local_1b8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
    if (!bVar1) {
      testing::Message::Message(&local_1c0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&__range1_2,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0xaab,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&__range1_2,&local_1c0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&__range1_2);
      testing::Message::~Message(&local_1c0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  }
  __begin1_2 = (const_iterator)0x30;
  local_1f0 = 0x38;
  local_1e8 = 0x40;
  local_1e0._M_array = (iterator)&__begin1_2;
  local_1e0._M_len = 3;
  local_1d0 = &local_1e0;
  __end1_2 = std::initializer_list<asn1_null_st_*REQUIRED_FIELD::*>::begin(local_1d0);
  poVar8 = std::initializer_list<asn1_null_st_*REQUIRED_FIELD::*>::end(local_1d0);
  for (; __end1_2 != poVar8; __end1_2 = __end1_2 + 1) {
    gtest_ar__2.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )*__end1_2;
    pRVar4 = REQUIRED_FIELD_new();
    std::unique_ptr<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)>::reset
              ((unique_ptr<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)> *)local_58,pRVar4);
    testing::AssertionResult::
    AssertionResult<std::unique_ptr<REQUIRED_FIELD,void(*)(REQUIRED_FIELD*)>>
              ((AssertionResult *)local_220,
               (unique_ptr<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)> *)local_58,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
    if (!bVar1) {
      testing::Message::Message(&local_228);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_3.message_,(internal *)local_220,(AssertionResult *)0x8733ab,
                 "false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_230,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0xab1,pcVar2);
      testing::internal::AssertHelper::operator=(&local_230,&local_228);
      testing::internal::AssertHelper::~AssertHelper(&local_230);
      std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_228);
    }
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
    if (gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ != 0) goto LAB_0021178f;
    pRVar5 = std::unique_ptr<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)>::operator*
                       ((unique_ptr<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)> *)local_58);
    *(undefined8 *)
     ((long)&pRVar5->value +
     (long)gtest_ar__2.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl) = 0;
    local_268[1] = 0xffffffff;
    pRVar6 = std::unique_ptr<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)>::get
                       ((unique_ptr<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)> *)local_58);
    local_268[0] = i2d_REQUIRED_FIELD(pRVar6,(uchar **)0x0);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_260,"-1","i2d_REQUIRED_FIELD(obj.get(), nullptr)",local_268 + 1,
               local_268);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
    if (!bVar1) {
      testing::Message::Message(&local_270);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_260);
      testing::internal::AssertHelper::AssertHelper
                (&local_278,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0xab3,pcVar2);
      testing::internal::AssertHelper::operator=(&local_278,&local_270);
      testing::internal::AssertHelper::~AssertHelper(&local_278);
      testing::Message::~Message(&local_270);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
  }
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 0;
LAB_0021178f:
  std::unique_ptr<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)>::~unique_ptr
            ((unique_ptr<REQUIRED_FIELD,_void_(*)(REQUIRED_FIELD_*)> *)local_58);
  return;
}

Assistant:

TEST(ASN1Test, MissingRequiredField) {
  EXPECT_EQ(-1, i2d_REQUIRED_FIELD(nullptr, nullptr));

  std::unique_ptr<REQUIRED_FIELD, decltype(&REQUIRED_FIELD_free)> obj(
      nullptr, REQUIRED_FIELD_free);
  for (auto field : {&REQUIRED_FIELD::value, &REQUIRED_FIELD::value_imp,
                     &REQUIRED_FIELD::value_exp}) {
    obj.reset(REQUIRED_FIELD_new());
    ASSERT_TRUE(obj);
    ASN1_INTEGER_free((*obj).*field);
    (*obj).*field = nullptr;
    EXPECT_EQ(-1, i2d_REQUIRED_FIELD(obj.get(), nullptr));
  }

  for (auto field : {&REQUIRED_FIELD::seq, &REQUIRED_FIELD::seq_imp,
                     &REQUIRED_FIELD::seq_exp}) {
    obj.reset(REQUIRED_FIELD_new());
    ASSERT_TRUE(obj);
    sk_ASN1_INTEGER_pop_free((*obj).*field, ASN1_INTEGER_free);
    (*obj).*field = nullptr;
    EXPECT_EQ(-1, i2d_REQUIRED_FIELD(obj.get(), nullptr));
  }

  for (auto field : {&REQUIRED_FIELD::null, &REQUIRED_FIELD::null_imp,
                     &REQUIRED_FIELD::null_exp}) {
    obj.reset(REQUIRED_FIELD_new());
    ASSERT_TRUE(obj);
    (*obj).*field = nullptr;
    EXPECT_EQ(-1, i2d_REQUIRED_FIELD(obj.get(), nullptr));
  }
}